

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9ResourceULT.cpp
# Opt level: O1

void __thiscall
CTestGen9Resource_Test1DTileYsResourceMips_Test::TestBody
          (CTestGen9Resource_Test1DTileYsResourceMips_Test *this)

{
  uint32_t uVar1;
  undefined1 auVar2 [16];
  CTestGen9Resource_Test1DTileYsResourceMips_Test *this_00;
  bool bVar3;
  undefined4 uVar4;
  GMM_RESOURCE_INFO *ResourceInfo;
  ulong uVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  char *pcVar9;
  uint uVar10;
  ulong uVar11;
  uint *expected;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  long lVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  long lVar22;
  undefined1 in_XMM8 [16];
  long lVar23;
  undefined1 in_XMM9 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 in_XMM13 [16];
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  CTestGen9Resource_Test1DTileYsResourceMips_Test *local_120;
  undefined1 auStack_118 [8];
  GMM_REQ_OFFSET_INFO OffsetInfo;
  undefined8 uStack_a8;
  uint32_t MipTailOffsets [15];
  uint32_t MipTailStart;
  AssertHelper local_58;
  uint local_4c;
  AssertHelper AStack_48;
  uint32_t StartOfMip;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  AssertionResult gtest_ar_5;
  ulong uVar27;
  
  local_148 = 0;
  uStack_190 = 0;
  uStack_160 = 0;
  local_138 = 0;
  uStack_130 = 0;
  local_158 = 0;
  uStack_150 = 0;
  uStack_170 = 0;
  local_188 = 0;
  uStack_180 = 0;
  local_1a8 = 1;
  uStack_140 = 0x100000000;
  uStack_1a0 = 0x400000000;
  local_198 = 0x4000000000;
  local_168 = 5;
  uVar12 = 0;
  local_120 = this;
  do {
    uVar4 = 0;
    if (uVar12 < 5) {
      uVar4 = (&DAT_001ad00c)[uVar12];
    }
    local_1a8 = CONCAT44(uVar4,(undefined4)local_1a8);
    local_178 = 0x4000;
    uStack_170 = CONCAT44(uStack_170._4_4_,1);
    ResourceInfo = (GMM_RESOURCE_INFO *)
                   (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                             (CommonULT::pGmmULTClientContext,&local_1a8);
    this_00 = local_120;
    MipTailOffsets[0xd] = (uint)local_168;
    uVar11 = 0;
    in_XMM13 = pmovsxbq(in_XMM13,0x404);
    do {
      uVar1 = (uint32_t)uVar11;
      if (local_178 >> ((byte)uVar11 & 0x3f) <= (ulong)(uint)(&DAT_001ac310)[uVar12]) break;
      uVar10 = (uint32_t)uVar11 + 1;
      uVar11 = (ulong)uVar10;
      uVar1 = MipTailOffsets[0xd];
    } while (uVar10 <= (uint)local_168);
    MipTailOffsets[0xd] = uVar1;
    uVar8 = (ulong)((int)uVar11 + 1);
    uVar10 = (&DAT_001ac2f0)[uVar12] - 1;
    uVar5 = uVar8 + 3 & 0xfffffffffffffffc;
    lVar7 = uVar8 - 1;
    auVar14._8_4_ = (int)lVar7;
    auVar14._0_8_ = lVar7;
    auVar14._12_4_ = (int)((ulong)lVar7 >> 0x20);
    auVar20._8_4_ = (undefined4)local_178;
    auVar20._0_8_ = local_178;
    auVar20._12_4_ = local_178._4_4_;
    uVar8 = ~(ulong)uVar10;
    uVar4 = (undefined4)(uVar8 >> 0x20);
    in_XMM8 = pmovsxbq(in_XMM8,0x100);
    in_XMM9 = pmovsxbq(in_XMM9,0x302);
    auVar17 = (undefined1  [16])0x0;
    do {
      auVar24 = in_XMM9;
      auVar21 = in_XMM8;
      auVar15 = auVar17;
      lVar22 = auVar21._0_8_;
      uVar27 = auVar20._8_8_;
      auVar25._0_8_ = local_178 >> lVar22;
      auVar25._8_8_ = uVar27 >> lVar22;
      lVar7 = auVar21._8_8_;
      auVar16._0_8_ = local_178 >> lVar7;
      auVar16._8_8_ = uVar27 >> lVar7;
      auVar17 = pblendw(auVar16,auVar25,0xf);
      lVar23 = auVar24._0_8_;
      auVar26._0_8_ = local_178 >> lVar23;
      auVar26._8_8_ = uVar27 >> lVar23;
      lVar19 = auVar24._8_8_;
      auVar28._0_8_ = local_178 >> lVar19;
      auVar28._8_8_ = uVar27 >> lVar19;
      auVar29 = pblendw(auVar28,auVar26,0xf);
      auVar30._0_8_ = auVar29._0_8_ + (ulong)uVar10;
      auVar30._8_8_ = auVar29._8_8_ + (ulong)uVar10;
      auVar18._0_8_ = auVar17._0_8_ + (ulong)uVar10;
      auVar18._8_8_ = auVar17._8_8_ + (ulong)uVar10;
      auVar29._8_4_ = (int)uVar8;
      auVar29._0_8_ = uVar8;
      auVar29._12_4_ = uVar4;
      auVar2._8_4_ = (int)uVar8;
      auVar2._0_8_ = uVar8;
      auVar2._12_4_ = uVar4;
      auVar17._0_4_ = SUB164(auVar18 & auVar29,0) + auVar15._0_4_;
      auVar17._4_4_ = SUB164(auVar18 & auVar29,8) + auVar15._4_4_;
      auVar17._8_4_ = SUB164(auVar30 & auVar2,0) + auVar15._8_4_;
      auVar17._12_4_ = SUB164(auVar30 & auVar2,8) + auVar15._12_4_;
      in_XMM8._0_8_ = lVar22 + in_XMM13._0_8_;
      in_XMM8._8_8_ = lVar7 + in_XMM13._8_8_;
      in_XMM9._0_8_ = lVar23 + in_XMM13._0_8_;
      in_XMM9._8_8_ = lVar19 + in_XMM13._8_8_;
      uVar5 = uVar5 - 4;
    } while (uVar5 != 0);
    lVar7 = SUB168(auVar14 ^ _DAT_001aa8c0,0);
    auVar13._0_8_ = -(ulong)(lVar7 < SUB168(auVar21 ^ _DAT_001aa8c0,0));
    lVar19 = SUB168(auVar14 ^ _DAT_001aa8c0,8);
    auVar13._8_8_ = -(ulong)(lVar19 < SUB168(auVar21 ^ _DAT_001aa8c0,8));
    auVar21._0_8_ = -(ulong)(lVar7 < SUB168(auVar24 ^ _DAT_001aa8c0,0));
    auVar21._8_8_ = -(ulong)(lVar19 < SUB168(auVar24 ^ _DAT_001aa8c0,8));
    auVar14 = packssdw(auVar13,auVar21);
    auVar17 = blendvps(auVar17,auVar15,auVar14);
    uVar5 = 0;
    iVar6 = 0;
    if (uVar12 < 5) {
      iVar6 = (&DAT_001ad020)[uVar12];
    }
    auVar17 = phaddd(auVar17,auVar17);
    auVar17 = phaddd(auVar17,auVar17);
    uVar1 = (&DAT_001ac2f0)[uVar12];
    unique0x10000e35 = ResourceInfo;
    CTestResource::VerifyResourceHAlign<true>((CTestResource *)local_120,ResourceInfo,uVar1);
    CTestResource::VerifyResourceSize<true>
              ((CTestResource *)this_00,ResourceInfo,
               (ulong)(auVar17._0_4_ * iVar6 + 0xfffU & 0xfffff000));
    local_4c = 0;
    if ((int)uVar11 != 0) {
      uVar5 = 0;
      do {
        OffsetInfo.StdLayout.Offset = 0;
        OffsetInfo.StdLayout.TileRowPitch = 0;
        OffsetInfo.Render.XOffset = 0;
        OffsetInfo.Render.YOffset = 0;
        OffsetInfo.Render.ZOffset = 0;
        OffsetInfo.Render._20_4_ = 0;
        OffsetInfo.Lock.Pitch = 0;
        OffsetInfo.Lock.field_2 =
             (anon_union_4_2_7f1cee3a_for_anon_struct_16_3_bc420dd9_for_Lock_3)0x0;
        OffsetInfo.Render.field_0 =
             (anon_union_8_2_48ff183f_for_anon_struct_24_4_8d4e87d8_for_Render_0)0x0;
        OffsetInfo.Frame = GMM_DISPLAY_BASE;
        OffsetInfo._28_4_ = 0;
        OffsetInfo.Lock.field_0 =
             (anon_union_8_2_48ff183f_for_anon_struct_16_3_bc420dd9_for_Lock_0)0x0;
        OffsetInfo.MipLevel = 0;
        OffsetInfo.Slice = 0;
        OffsetInfo.CubeFace = __GMM_CUBE_FACE_POS_X;
        OffsetInfo.Plane = GMM_NO_PLANE;
        stack0xfffffffffffffeec = SUB1612((undefined1  [16])0x0,4);
        auStack_118._0_4_ = 1;
        OffsetInfo._0_4_ = (int)uVar5;
        OffsetInfo.ArrayIndex = 0;
        (**(code **)(*(long *)stack0xffffffffffffff98 + 0x68))(stack0xffffffffffffff98,auStack_118);
        if (uVar5 == 0) {
          iVar6 = 0;
        }
        else {
          iVar6 = 0;
          if (uVar12 < 5) {
            iVar6 = (&DAT_001ad020)[uVar12];
          }
          iVar6 = ((int)(local_178 >> ((char)uVar5 - 1U & 0x3f)) + (uVar1 - 1) & ~(uVar1 - 1)) *
                  iVar6;
        }
        local_4c = local_4c + iVar6;
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                  ((internal *)&uStack_a8,"StartOfMip","OffsetInfo.Render.Offset64",&local_4c,
                   (unsigned_long *)&OffsetInfo.Lock.Pitch);
        if (uStack_a8._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_40);
          pcVar9 = "";
          if (MipTailOffsets._0_8_ != 0) {
            pcVar9 = *(char **)MipTailOffsets._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&stack0xffffffffffffffb8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                     ,0x199,pcVar9);
          testing::internal::AssertHelper::operator=(&stack0xffffffffffffffb8,(Message *)&local_40);
          testing::internal::AssertHelper::~AssertHelper(&stack0xffffffffffffffb8);
          if (local_40.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar3 = testing::internal::IsTrue(true);
            if ((bVar3) &&
               (local_40.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_40.ptr_ + 8))();
            }
            local_40.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)MipTailOffsets,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_40.ptr_ = local_40.ptr_ & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<int,unsigned_int>
                  ((internal *)&uStack_a8,"0","OffsetInfo.Render.XOffset",(int *)&local_40,
                   (uint *)&OffsetInfo.Render);
        if (uStack_a8._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_40);
          pcVar9 = "";
          if (MipTailOffsets._0_8_ != 0) {
            pcVar9 = *(char **)MipTailOffsets._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&stack0xffffffffffffffb8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                     ,0x19a,pcVar9);
          testing::internal::AssertHelper::operator=(&stack0xffffffffffffffb8,(Message *)&local_40);
          testing::internal::AssertHelper::~AssertHelper(&stack0xffffffffffffffb8);
          if (local_40.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar3 = testing::internal::IsTrue(true);
            if ((bVar3) &&
               (local_40.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_40.ptr_ + 8))();
            }
            local_40.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)MipTailOffsets,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_40.ptr_ = local_40.ptr_ & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<int,unsigned_int>
                  ((internal *)&uStack_a8,"0","OffsetInfo.Render.YOffset",(int *)&local_40,
                   (uint *)((long)&OffsetInfo.Render.field_0 + 4));
        if (uStack_a8._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_40);
          pcVar9 = "";
          if (MipTailOffsets._0_8_ != 0) {
            pcVar9 = *(char **)MipTailOffsets._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&stack0xffffffffffffffb8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                     ,0x19b,pcVar9);
          testing::internal::AssertHelper::operator=(&stack0xffffffffffffffb8,(Message *)&local_40);
          testing::internal::AssertHelper::~AssertHelper(&stack0xffffffffffffffb8);
          if (local_40.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar3 = testing::internal::IsTrue(true);
            if ((bVar3) &&
               (local_40.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_40.ptr_ + 8))();
            }
            local_40.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)MipTailOffsets,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_40.ptr_ = local_40.ptr_ & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<int,unsigned_int>
                  ((internal *)&uStack_a8,"0","OffsetInfo.Render.ZOffset",(int *)&local_40,
                   &OffsetInfo.Render.XOffset);
        if (uStack_a8._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_40);
          pcVar9 = "";
          if (MipTailOffsets._0_8_ != 0) {
            pcVar9 = *(char **)MipTailOffsets._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&stack0xffffffffffffffb8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                     ,0x19c,pcVar9);
          testing::internal::AssertHelper::operator=(&stack0xffffffffffffffb8,(Message *)&local_40);
          testing::internal::AssertHelper::~AssertHelper(&stack0xffffffffffffffb8);
          if (local_40.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar3 = testing::internal::IsTrue(true);
            if ((bVar3) &&
               (local_40.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_40.ptr_ + 8))();
            }
            local_40.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)MipTailOffsets,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        uVar5 = uVar5 + 1;
      } while (uVar11 != uVar5);
    }
    MipTailOffsets[10] = 0xc0;
    MipTailOffsets[0xb] = 0x80;
    MipTailOffsets[0xc] = 0x40;
    MipTailOffsets[6] = 0x1c0;
    MipTailOffsets[7] = 0x180;
    MipTailOffsets[8] = 0x140;
    MipTailOffsets[9] = 0x100;
    MipTailOffsets[2] = 0x800;
    MipTailOffsets[3] = 0x400;
    MipTailOffsets[4] = 0x300;
    MipTailOffsets[5] = 0x200;
    uStack_a8 = 0x400000008000;
    MipTailOffsets[0] = 0x2000;
    MipTailOffsets[1] = 0x1000;
    uVar4 = (**(code **)(*(long *)stack0xffffffffffffff98 + 0x90))();
    local_40.ptr_._0_4_ = uVar4;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              ((internal *)auStack_118,"MipTailStart","ResourceInfo->GetPackedMipTailStartLod()",
               MipTailOffsets + 0xd,(uint *)&local_40);
    if (auStack_118[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_40);
      pcVar9 = "";
      if (OffsetInfo._0_8_ != 0) {
        pcVar9 = *(char **)OffsetInfo._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&stack0xffffffffffffffb8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                 ,0x1a1,pcVar9);
      testing::internal::AssertHelper::operator=(&stack0xffffffffffffffb8,(Message *)&local_40);
      testing::internal::AssertHelper::~AssertHelper(&stack0xffffffffffffffb8);
      if (local_40.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) &&
           (local_40.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_40.ptr_ + 8))();
        }
        local_40.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&OffsetInfo,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    iVar6 = 0;
    if (uVar12 < 5) {
      iVar6 = (&DAT_001ad020)[uVar12];
    }
    local_4c = local_4c +
               (~(uVar1 - 1) & (int)(local_178 >> ((char)uVar5 - 1U & 0x3f)) + (uVar1 - 1)) * iVar6;
    if ((uint)uVar5 <= (uint)local_168) {
      expected = (uint *)&uStack_a8;
      do {
        OffsetInfo.StdLayout.Offset = 0;
        OffsetInfo.StdLayout.TileRowPitch = 0;
        OffsetInfo.Render.XOffset = 0;
        OffsetInfo.Render.YOffset = 0;
        OffsetInfo.Render.ZOffset = 0;
        OffsetInfo.Render._20_4_ = 0;
        OffsetInfo.Lock.Pitch = 0;
        OffsetInfo.Lock.field_2 =
             (anon_union_4_2_7f1cee3a_for_anon_struct_16_3_bc420dd9_for_Lock_3)0x0;
        OffsetInfo.Render.field_0 =
             (anon_union_8_2_48ff183f_for_anon_struct_24_4_8d4e87d8_for_Render_0)0x0;
        OffsetInfo.Frame = GMM_DISPLAY_BASE;
        OffsetInfo._28_4_ = 0;
        OffsetInfo.Lock.field_0 =
             (anon_union_8_2_48ff183f_for_anon_struct_16_3_bc420dd9_for_Lock_0)0x0;
        OffsetInfo.MipLevel = 0;
        OffsetInfo.Slice = 0;
        OffsetInfo.CubeFace = __GMM_CUBE_FACE_POS_X;
        OffsetInfo.Plane = GMM_NO_PLANE;
        stack0xfffffffffffffeec = SUB1612((undefined1  [16])0x0,4);
        auStack_118._0_4_ = 1;
        uVar10 = (uint)uVar5;
        OffsetInfo._0_4_ = uVar10;
        OffsetInfo.ArrayIndex = 0;
        (**(code **)(*(long *)stack0xffffffffffffff98 + 0x68))(stack0xffffffffffffff98,auStack_118);
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                  ((internal *)&local_40,"StartOfMip","OffsetInfo.Render.Offset64",&local_4c,
                   (unsigned_long *)&OffsetInfo.Lock.Pitch);
        if (local_40.ptr_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&stack0xffffffffffffffb8);
          pcVar9 = "";
          if (gtest_ar_5._0_8_ != 0) {
            pcVar9 = *(char **)gtest_ar_5._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_58,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                     ,0x1a9,pcVar9);
          testing::internal::AssertHelper::operator=(&local_58,(Message *)&stack0xffffffffffffffb8);
          testing::internal::AssertHelper::~AssertHelper(&local_58);
          if (AStack_48.data_ != (AssertHelperData *)0x0) {
            bVar3 = testing::internal::IsTrue(true);
            if ((bVar3) && (AStack_48.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)AStack_48.data_ + 8))();
            }
            AStack_48.data_ = (AssertHelperData *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar_5,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                  ((internal *)&local_40,"MipTailOffsets[slot]","OffsetInfo.Render.XOffset",expected
                   ,(uint *)&OffsetInfo.Render);
        if (local_40.ptr_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&stack0xffffffffffffffb8);
          pcVar9 = "";
          if (gtest_ar_5._0_8_ != 0) {
            pcVar9 = *(char **)gtest_ar_5._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_58,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                     ,0x1aa,pcVar9);
          testing::internal::AssertHelper::operator=(&local_58,(Message *)&stack0xffffffffffffffb8);
          testing::internal::AssertHelper::~AssertHelper(&local_58);
          if (AStack_48.data_ != (AssertHelperData *)0x0) {
            bVar3 = testing::internal::IsTrue(true);
            if ((bVar3) && (AStack_48.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)AStack_48.data_ + 8))();
            }
            AStack_48.data_ = (AssertHelperData *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar_5,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        AStack_48.data_ = AStack_48.data_ & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<int,unsigned_int>
                  ((internal *)&local_40,"0","OffsetInfo.Render.YOffset",
                   (int *)&stack0xffffffffffffffb8,(uint *)((long)&OffsetInfo.Render.field_0 + 4));
        if (local_40.ptr_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&stack0xffffffffffffffb8);
          pcVar9 = "";
          if (gtest_ar_5._0_8_ != 0) {
            pcVar9 = *(char **)gtest_ar_5._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_58,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                     ,0x1ab,pcVar9);
          testing::internal::AssertHelper::operator=(&local_58,(Message *)&stack0xffffffffffffffb8);
          testing::internal::AssertHelper::~AssertHelper(&local_58);
          if (AStack_48.data_ != (AssertHelperData *)0x0) {
            bVar3 = testing::internal::IsTrue(true);
            if ((bVar3) && (AStack_48.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)AStack_48.data_ + 8))();
            }
            AStack_48.data_ = (AssertHelperData *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar_5,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        AStack_48.data_ = AStack_48.data_ & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<int,unsigned_int>
                  ((internal *)&local_40,"0","OffsetInfo.Render.ZOffset",
                   (int *)&stack0xffffffffffffffb8,&OffsetInfo.Render.XOffset);
        if (local_40.ptr_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&stack0xffffffffffffffb8);
          pcVar9 = "";
          if (gtest_ar_5._0_8_ != 0) {
            pcVar9 = *(char **)gtest_ar_5._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_58,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                     ,0x1ac,pcVar9);
          testing::internal::AssertHelper::operator=(&local_58,(Message *)&stack0xffffffffffffffb8);
          testing::internal::AssertHelper::~AssertHelper(&local_58);
          if (AStack_48.data_ != (AssertHelperData *)0x0) {
            bVar3 = testing::internal::IsTrue(true);
            if ((bVar3) && (AStack_48.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)AStack_48.data_ + 8))();
            }
            AStack_48.data_ = (AssertHelperData *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar_5,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        expected = expected + 1;
        uVar5 = (ulong)(uVar10 + 1);
      } while (uVar10 < (uint)local_168);
    }
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,stack0xffffffffffffff98);
    uVar12 = uVar12 + 1;
    if (uVar12 == 5) {
      return;
    }
  } while( true );
}

Assistant:

TEST_F(CTestGen9Resource, Test1DTileYsResourceMips)
{
    const uint32_t TileSize[TEST_BPP_MAX] = {65536, 32768, 16384, 8192, 4096};
    const uint32_t Mts[TEST_BPP_MAX]      = {32768, 16384, 8192, 4096, 2048};

    GMM_RESCREATE_PARAMS gmmParams = {};
    gmmParams.Type                 = RESOURCE_1D;
    gmmParams.NoGfxMemory          = 1;
    gmmParams.Flags.Info.TiledYs   = 1;
    gmmParams.Flags.Gpu.Texture    = 1;
    gmmParams.MaxLod               = 5;

    // Allocate all mips in 1 tile or multiple tiles, depending on the bpp
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = 16 * 1024; // 16K is the max width you can specify
        gmmParams.BaseHeight  = 0x1;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        uint32_t MaxMip;
        uint32_t MipTailStart = gmmParams.MaxLod;
        for(MaxMip = 0; MaxMip <= gmmParams.MaxLod; MaxMip++)
        {
            if((gmmParams.BaseWidth64 >> MaxMip) <= Mts[i])
            {
                MipTailStart = MaxMip;
                break;
            }
        }

        uint32_t AlignedWidth = 0;
        for(int mip = 0; mip <= MaxMip; mip++)
        {
            // Since 1D doesn't have a height, mips are just based on width
            AlignedWidth += GMM_ULT_ALIGN(gmmParams.BaseWidth64 >> mip, TileSize[i]);
            ;
        }

        uint32_t PitchInBytes = AlignedWidth * GetBppValue(bpp);
        uint32_t AlignedSize  = GMM_ULT_ALIGN(PitchInBytes, PAGE_SIZE);

        VerifyResourceHAlign<true>(ResourceInfo, TileSize[i]);
        VerifyResourceVAlign<false>(ResourceInfo, 0);       // N/A for 1D
        VerifyResourcePitch<false>(ResourceInfo, 0);        // N/A for 1D
        VerifyResourcePitchInTiles<false>(ResourceInfo, 0); // N/A for linear
        VerifyResourceSize<true>(ResourceInfo, AlignedSize);
        VerifyResourceQPitch<false>(ResourceInfo, 0); // N/A for non-arrayed

        // All mips should be right after one another linearly, until the miptail
        uint32_t StartOfMip = 0;
        int      mip;
        for(mip = 0; mip < MaxMip; mip++)
        {
            GMM_REQ_OFFSET_INFO OffsetInfo = {};
            OffsetInfo.ReqRender           = 1;
            OffsetInfo.MipLevel            = mip;
            ResourceInfo->GetOffset(OffsetInfo);
            StartOfMip += (mip == 0 ? 0 : GMM_ULT_ALIGN(gmmParams.BaseWidth64 >> (mip - 1), TileSize[i]) * GetBppValue(bpp));
            EXPECT_EQ(StartOfMip, OffsetInfo.Render.Offset64);
            EXPECT_EQ(0, OffsetInfo.Render.XOffset);
            EXPECT_EQ(0, OffsetInfo.Render.YOffset);
            EXPECT_EQ(0, OffsetInfo.Render.ZOffset);
        }

        uint32_t MipTailOffsets[GMM_ULT_MAX_MIPMAP] = {32768, 16384, 8192, 4096, 2048, 1024, 768, 512, 448, 384, 320, 256, 192, 128, 64};
        // Check for offset inside miptails.
        EXPECT_EQ(MipTailStart, ResourceInfo->GetPackedMipTailStartLod());
        StartOfMip += GMM_ULT_ALIGN(gmmParams.BaseWidth64 >> (mip - 1), TileSize[i]) * GetBppValue(bpp); // Start of MipTail
        for(int slot = 0; mip <= gmmParams.MaxLod; mip++, slot++)
        {
            GMM_REQ_OFFSET_INFO OffsetInfo = {};
            OffsetInfo.ReqRender           = 1;
            OffsetInfo.MipLevel            = mip;
            ResourceInfo->GetOffset(OffsetInfo);
            EXPECT_EQ(StartOfMip, OffsetInfo.Render.Offset64);          // Start of Miptail
            EXPECT_EQ(MipTailOffsets[slot], OffsetInfo.Render.XOffset); // Offset within miptail
            EXPECT_EQ(0, OffsetInfo.Render.YOffset);
            EXPECT_EQ(0, OffsetInfo.Render.ZOffset);
        }

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }
}